

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O2

size_t fiobj_str_readfile(FIOBJ dest,char *filename,intptr_t start_at,intptr_t limit)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  size_t sVar3;
  char *__dest;
  size_t size;
  int *piVar4;
  ulong size_00;
  fio_str_s_conflict *s;
  long __offset;
  fio_str_info_s state;
  fio_str_info_s local_d8;
  stat f_data;
  
  state.capa = 0;
  state.len = 0;
  state.data = (char *)0x0;
  if (filename == (char *)0x0) {
    return 0;
  }
  if ((*filename == '~') &&
     (((filename[1] == '\\' || (filename[1] == '/')) && (__s = getenv("HOME"), __s != (char *)0x0)))
     ) {
    sVar2 = strlen(filename);
    sVar3 = strlen(__s);
    size_00 = sVar3 + sVar2;
    if (0xffff < size_00) {
      return 0;
    }
    if ((__s[sVar3 - 1] == '\\') || (__s[sVar3 - 1] == '/')) {
      size_00 = (sVar3 + sVar2) - 1;
      sVar3 = sVar3 - 1;
    }
    __dest = (char *)fio_malloc(size_00);
    if (__dest == (char *)0x0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.h:4497"
                      );
      }
      kill(0,2);
      piVar4 = __errno_location();
      exit(*piVar4);
    }
    memcpy(__dest,__s,sVar3);
    memcpy(__dest + sVar3,filename + 1,sVar2);
    __dest[size_00 - 1] = '\0';
    filename = __dest;
  }
  else {
    __dest = (char *)0x0;
  }
  iVar1 = stat(filename,(stat *)&f_data);
  if (iVar1 == 0) {
    s = (fio_str_s_conflict *)((dest & 0xfffffffffffffff8) + 0x10);
    if (f_data.st_size < 1 || f_data.st_size <= start_at) {
      fio_str_info(&state,s);
    }
    else {
      iVar1 = open(filename,0);
      if (iVar1 != -1) {
        __offset = 0;
        if (0 < start_at + f_data.st_size) {
          __offset = start_at + f_data.st_size;
        }
        if (-1 < start_at) {
          __offset = start_at;
        }
        sVar2 = limit;
        if ((ulong)f_data.st_size < (ulong)(__offset + limit)) {
          sVar2 = f_data.st_size - __offset;
        }
        if (limit < 1) {
          sVar2 = f_data.st_size - __offset;
        }
        size = fio_str_len(s);
        fio_str_resize(&state,s,size + sVar2);
        sVar3 = pread(iVar1,state.data + size,sVar2,__offset);
        if (sVar3 != sVar2) {
          fio_str_resize(&local_d8,s,size);
          state.capa = 0;
          state.len = 0;
          state.data = (char *)0x0;
        }
        close(iVar1);
      }
    }
  }
  fio_free(__dest);
  return state.len;
}

Assistant:

size_t fiobj_str_readfile(FIOBJ dest, const char *filename, intptr_t start_at,
                          intptr_t limit) {
  fio_str_info_s state =
      fio_str_readfile(&obj2str(dest)->str, filename, start_at, limit);
  return state.len;
}